

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O1

vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_> *
DiffSectorCopies(vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
                 *__return_storage_ptr__,Sector *sector)

{
  pointer pDVar1;
  pointer puVar2;
  iterator iVar3;
  int iVar4;
  int iVar5;
  DataList *pDVar6;
  Data *data;
  pointer pDVar7;
  pointer puVar8;
  pointer puVar9;
  pointer puVar10;
  pointer pDVar11;
  pointer puVar12;
  pointer puVar13;
  pointer puVar14;
  pointer pDVar15;
  pair<char,_unsigned_long> local_58;
  vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>> *local_48;
  pointer local_40;
  pointer local_38;
  
  iVar4 = Sector::copies(sector);
  if (iVar4 < 1) {
    __assert_fail("sector.copies() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/DiskUtil.cpp"
                  ,0x2a0,"std::vector<std::pair<char, size_t>> DiffSectorCopies(const Sector &)");
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = (vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>> *)
             __return_storage_ptr__;
  pDVar6 = Sector::datas(sector);
  pDVar11 = (pDVar6->super__Vector_base<Data,_std::allocator<Data>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pDVar6 = Sector::datas(sector);
  pDVar1 = (pDVar6->super__Vector_base<Data,_std::allocator<Data>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  pDVar7 = pDVar11 + 1;
  pDVar15 = pDVar11;
  if (pDVar7 != pDVar1 && pDVar11 != pDVar1) {
    do {
      pDVar11 = pDVar7;
      if (*(int *)&(pDVar15->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
          *(int *)&(pDVar15->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start <=
          *(int *)&(pDVar7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
          *(int *)&(pDVar7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start) {
        pDVar11 = pDVar15;
      }
      pDVar7 = pDVar7 + 1;
      pDVar15 = pDVar11;
    } while (pDVar7 != pDVar1);
  }
  puVar14 = (pDVar11->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_38 = (pDVar11->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  iVar4 = 0;
  if (puVar14 < local_38) {
    iVar4 = 0;
    do {
      puVar2 = (pDVar11->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pDVar6 = Sector::datas(sector);
      puVar9 = local_38 + -(long)puVar14;
      pDVar7 = (pDVar6->super__Vector_base<Data,_std::allocator<Data>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pDVar1 = (pDVar6->super__Vector_base<Data,_std::allocator<Data>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pDVar7 != pDVar1) {
        do {
          if (puVar9 != (pointer)0x0) {
            puVar12 = (pointer)0x0;
            do {
              puVar8 = puVar12;
              if (puVar14[(long)puVar12] !=
                  puVar14[(long)(puVar12 +
                                ((long)(pDVar7->
                                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start - (long)puVar2))])
              break;
              puVar12 = puVar12 + 1;
              puVar8 = puVar9;
            } while (puVar9 != puVar12);
            if ((long)puVar8 < (long)puVar9) {
              puVar9 = puVar8;
            }
          }
          pDVar7 = pDVar7 + 1;
        } while (pDVar7 != pDVar1);
      }
      if ((0xf < (long)puVar9) || ((puVar12 = puVar9, puVar14 == puVar2 && (0 < (long)puVar9)))) {
        if (iVar4 != 0) {
          local_58.first = '-';
          local_58.second = (unsigned_long)iVar4;
          iVar3._M_current = *(pair<char,_unsigned_long> **)(local_48 + 8);
          if (iVar3._M_current == *(pair<char,_unsigned_long> **)(local_48 + 0x10)) {
            std::vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>>
            ::_M_realloc_insert<std::pair<char,unsigned_long>>(local_48,iVar3,&local_58);
          }
          else {
            *(ulong *)iVar3._M_current = CONCAT71(local_58._1_7_,0x2d);
            (iVar3._M_current)->second = local_58.second;
            *(long *)(local_48 + 8) = *(long *)(local_48 + 8) + 0x10;
          }
          iVar4 = 0;
        }
        local_58.first = '=';
        iVar3._M_current = *(pair<char,_unsigned_long> **)(local_48 + 8);
        local_58.second = (unsigned_long)puVar9;
        if (iVar3._M_current == *(pair<char,_unsigned_long> **)(local_48 + 0x10)) {
          std::vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>>::
          _M_realloc_insert<std::pair<char,unsigned_long>>(local_48,iVar3,&local_58);
        }
        else {
          *(ulong *)iVar3._M_current = CONCAT71(local_58._1_7_,0x3d);
          (iVar3._M_current)->second = (unsigned_long)puVar9;
          *(long *)(local_48 + 8) = *(long *)(local_48 + 8) + 0x10;
        }
        local_40 = (pointer)0x0;
        puVar12 = local_40;
      }
      local_40 = puVar12;
      puVar14 = puVar14 + (long)puVar9;
      puVar2 = (pDVar11->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pDVar6 = Sector::datas(sector);
      puVar9 = local_38 + -(long)puVar14;
      for (pDVar7 = (pDVar6->super__Vector_base<Data,_std::allocator<Data>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pDVar7 != (pDVar6->super__Vector_base<Data,_std::allocator<Data>_>)._M_impl.
                    super__Vector_impl_data._M_finish; pDVar7 = pDVar7 + 1) {
        if (puVar9 != (pointer)0x0) {
          puVar8 = puVar14 + ((long)(pDVar7->
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start - (long)puVar2);
          puVar12 = puVar8;
          if (puVar8 != puVar8 + (long)(puVar9 + -1)) {
            puVar13 = puVar9 + -1;
            puVar10 = puVar8;
            do {
              puVar12 = puVar10;
              if (*puVar10 != puVar10[1]) break;
              puVar10 = puVar10 + 1;
              puVar13 = puVar13 + -1;
              puVar12 = puVar8 + (long)(puVar9 + -1);
            } while (puVar13 != (pointer)0x0);
          }
          if ((long)(puVar12 + (1 - (long)puVar8)) < (long)puVar9) {
            puVar9 = puVar12 + (1 - (long)puVar8);
          }
        }
      }
      if ((long)puVar9 < 0x10) {
        iVar5 = (int)puVar9;
      }
      else {
        if (iVar4 != 0) {
          local_58.first = '-';
          local_58.second = (unsigned_long)iVar4;
          iVar3._M_current = *(pair<char,_unsigned_long> **)(local_48 + 8);
          if (iVar3._M_current == *(pair<char,_unsigned_long> **)(local_48 + 0x10)) {
            std::vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>>
            ::_M_realloc_insert<std::pair<char,unsigned_long>>(local_48,iVar3,&local_58);
          }
          else {
            *(ulong *)iVar3._M_current = CONCAT71(local_58._1_7_,0x2d);
            (iVar3._M_current)->second = local_58.second;
            *(long *)(local_48 + 8) = *(long *)(local_48 + 8) + 0x10;
          }
          iVar4 = 0;
        }
        local_58.first = '+';
        iVar3._M_current = *(pair<char,_unsigned_long> **)(local_48 + 8);
        local_58.second = (unsigned_long)puVar9;
        if (iVar3._M_current == *(pair<char,_unsigned_long> **)(local_48 + 0x10)) {
          std::vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>>::
          _M_realloc_insert<std::pair<char,unsigned_long>>(local_48,iVar3,&local_58);
        }
        else {
          *(ulong *)iVar3._M_current = CONCAT71(local_58._1_7_,0x2b);
          (iVar3._M_current)->second = (unsigned_long)puVar9;
          *(long *)(local_48 + 8) = *(long *)(local_48 + 8) + 0x10;
        }
        iVar5 = 0;
      }
      puVar14 = puVar14 + (long)puVar9;
      iVar4 = iVar5 + (int)local_40 + iVar4;
    } while (puVar14 < local_38);
  }
  if (iVar4 != 0) {
    local_58.first = '-';
    local_58.second = (unsigned_long)iVar4;
    iVar3._M_current = *(pair<char,_unsigned_long> **)(local_48 + 8);
    if (iVar3._M_current == *(pair<char,_unsigned_long> **)(local_48 + 0x10)) {
      std::vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>>::
      _M_realloc_insert<std::pair<char,unsigned_long>>(local_48,iVar3,&local_58);
    }
    else {
      *(ulong *)iVar3._M_current = CONCAT71(local_58._1_7_,0x2d);
      (iVar3._M_current)->second = local_58.second;
      *(long *)(local_48 + 8) = *(long *)(local_48 + 8) + 0x10;
    }
  }
  return (vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_> *
         )local_48;
}

Assistant:

std::vector<std::pair<char, size_t>> DiffSectorCopies(const Sector& sector)
{
    assert(sector.copies() > 0);
    std::vector<std::pair<char, size_t>> diffs;

    auto& smallest = *std::min_element(
        sector.datas().begin(), sector.datas().end(),
        [](const Data& d1, const Data& d2) {
            return d1.size() < d2.size();
        }
    );
    auto it = smallest.begin();
    auto itEnd = smallest.end();

    //  int extent = pt_->GetDataExtent(nSector_);  // ToDo
    auto change_count = 0;

    auto diff = 0;
    while (it < itEnd)
    {
        auto offset = std::distance(smallest.begin(), it);
        auto same = std::distance(it, itEnd);

        for (const auto& data : sector.datas())
        {
            if (same)
            {
                // Find the prefix length where all data copies match
                auto pair = std::mismatch(it, it + same, data.begin() + offset);
                auto offset2 = std::distance(it, pair.first);
                same = std::min(same, offset2);
            }
        }
        it = it + same;

        // Show the matching block if big enough or if found
        // at the start of the data field. Other fragments will
        // be added to the diff block.
        if (same >= MIN_DIFF_BLOCK || (offset == 0 && same > 0))
        {
            if (diff)
            {
                ++change_count;
                diffs.push_back(std::make_pair('-', diff));
                diff = 0;
            }

            ++change_count;
            diffs.push_back(std::make_pair('=', same));
            same = 0;
        }

        offset = std::distance(smallest.begin(), it);
        auto match = std::distance(it, itEnd);

        for (const auto& data : sector.datas())
        {
            if (match)
            {
                // Find the prefix length where each copy has matching filler
                auto pair = std::mismatch(data.begin() + offset, data.begin() + offset + match - 1, data.begin() + offset + 1);
                auto offset2 = 1 + std::distance(data.begin() + offset, pair.first);
                match = std::min(match, offset2);
            }
        }
        it = it + match;

        // Show the filler block if big enough. Filler has matching
        // bytes in each copy, but a different value across copies.
        if (match >= MIN_DIFF_BLOCK)
        {
            if (diff)
            {
                ++change_count;
                diffs.push_back(std::make_pair('-', diff));
                diff = 0;
            }

            ++change_count;
            diffs.push_back(std::make_pair('+', match));
            match = 0;
        }

        diff += static_cast<int>(same + match);
    }

    if (diff)
    {
        ++change_count;
        diffs.push_back(std::make_pair('-', diff));
    }

    return diffs;
}